

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoserver.cpp
# Opt level: O3

void server_check_hangup(void *server_void)

{
  Client *this;
  bool bVar1;
  long *plVar2;
  EOClient *client;
  IPAddress local_44;
  double local_40;
  double local_38;
  
  local_38 = Timer::GetTime();
  plVar2 = *(long **)((long)server_void + 0x38);
  if (plVar2 != (long *)((long)server_void + 0x38)) {
    local_40 = *(double *)((long)server_void + 0xa8);
    do {
      this = (Client *)plVar2[2];
      bVar1 = Client::Connected(this);
      if (((bVar1) && (this->accepted == false)) &&
         (*(double *)((long)&this[1].send_buffer.field_2 + 8) + local_40 < local_38)) {
        local_44 = Client::GetRemoteAddr(this);
        EOServer::RecordClientRejection
                  ((EOServer *)server_void,&local_44,"hanging up on idle client");
        Client::Close(this,true);
      }
      plVar2 = (long *)*plVar2;
    } while (plVar2 != (long *)((long)server_void + 0x38));
  }
  return;
}

Assistant:

void server_check_hangup(void *server_void)
{
	EOServer *server = static_cast<EOServer *>(server_void);

	double now = Timer::GetTime();
	double delay = server->HangupDelay;

	UTIL_FOREACH(server->clients, rawclient)
	{
		EOClient *client = static_cast<EOClient *>(rawclient);

		if (client->Connected() && !client->Accepted() && client->start + delay < now)
		{
			server->RecordClientRejection(client->GetRemoteAddr(), "hanging up on idle client");
			client->Close(true);
		}
	}
}